

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O2

void __thiscall
QuasispeciesEdgeCalculator::computeOffsets
          (QuasispeciesEdgeCalculator *this,int s1,int s2,int e1,int e2,int *offset1,int *offset2,
          int *overlap)

{
  int iVar1;
  int iVar2;
  
  iVar2 = e1 - s1;
  if (e1 == e2 && s2 == s1) {
    *overlap = iVar2;
LAB_001796cc:
    *offset1 = 0;
  }
  else {
    iVar1 = e2 - s2;
    if (s2 == s1) {
      if (e1 < e2) {
        iVar1 = iVar2;
      }
      *overlap = iVar1;
      goto LAB_001796cc;
    }
    if (e1 == e2) {
      if (s2 < s1) {
        *overlap = iVar2;
LAB_0017970a:
        *offset1 = 0;
        iVar1 = iVar1 - *overlap;
        goto LAB_001796d3;
      }
      *overlap = iVar1;
LAB_001796fb:
      *offset1 = iVar2 - iVar1;
    }
    else {
      if (e1 < e2) {
        if (s2 <= s1) {
          *overlap = iVar2;
          *offset1 = 0;
          iVar1 = e1 - (s2 + *overlap);
          goto LAB_001796d3;
        }
        iVar1 = e1 - s2;
        *overlap = iVar1;
        goto LAB_001796fb;
      }
      if (s2 < s1) {
        *overlap = e2 - s1;
        goto LAB_0017970a;
      }
      *overlap = iVar1;
      *offset1 = s2 - s1;
    }
  }
  iVar1 = 0;
LAB_001796d3:
  *offset2 = iVar1;
  return;
}

Assistant:

void QuasispeciesEdgeCalculator::computeOffsets(int s1, int s2, int e1, int e2, int &offset1, int &offset2, int &overlap) const {
    int x_l1 = e1 - s1;
    int x_l2 = e2 - s2;
    if (s1 == s2 && e1 == e2) {
            // -----
            // -----
        overlap = e1 - s1;
        offset1 = 0;
        offset2 = 0;
    } else if (s1 == s2) {
            // ----  AND -----
            // ----- AND ----
        if (e1 < e2) {
            overlap = e1 - s1;
        } else {
            overlap = e2 - s2;
        }
        offset1 = 0;
        offset2 = 0;
    } else if (e1 == e2) {
            //  ---- AND -----
            // ----- AND  ----
        if (s1 > s2) {
            overlap = e1 - s1;
            offset1 = 0;
            offset2 = x_l2 - overlap;
        } else {
            overlap = e2 - s2;
            offset1 = x_l1 - overlap;
            offset2 = 0;
        }
    } else if (e1 < e2) {
            // ----    AND   --
            //   ----  AND ------
        if (s1 < s2) {
                // ----
                //   ----
            overlap = e1 - s2;
            offset1 = x_l1 - overlap;
            offset2 = 0;
        } else {
                //   --
                // ------
            overlap = e1 - s1;
            offset1 = 0;
            offset2 = e2 - (e2 - e1) - overlap - s2;
        }
    } else {
            //   ---- AND ------
            // ----   AND   --
        if (s2 < s1) {
                //   ----
                // ----
                //cout << "#########" << endl;
            overlap = e2 - s1;
            offset1 = 0;
            offset2 = x_l2 - overlap;
        } else {
                // ------
                //   --
            overlap = e2 - s2;
            offset1 = e1 - (e1 - e2) - overlap - s1;
            offset2 = 0;
        }
    }
}